

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UBXProtocol.h
# Opt level: O0

void SetChecksumUBX(uchar *packet,int packetlen)

{
  uchar local_1a;
  uchar local_19;
  int local_18;
  uchar CK_B;
  uchar CK_A;
  int i;
  int packetlen_local;
  uchar *packet_local;
  
  local_19 = '\0';
  local_1a = '\0';
  for (local_18 = 2; local_18 < packetlen + -2; local_18 = local_18 + 1) {
    local_19 = local_19 + packet[local_18];
    local_1a = local_1a + local_19;
  }
  packet[packetlen + -2] = local_19;
  packet[packetlen + -1] = local_1a;
  return;
}

Assistant:

inline void SetChecksumUBX(unsigned char* packet, int packetlen)
{
	int i = 0;
	unsigned char CK_A = 0, CK_B = 0;

	for (i = 2; i < packetlen-2; i++)
	{
		CK_A = (unsigned char)(CK_A + packet[i]);
		CK_B = (unsigned char)(CK_B + CK_A);
	}
	packet[packetlen-2] = CK_A;
	packet[packetlen-1] = CK_B;
}